

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

size_t al_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  iVar1 = f->ungetc_len;
  if (iVar1 != 0) {
    for (sVar3 = 0; (0 < iVar1 && (size != sVar3)); sVar3 = sVar3 + 1) {
      f->ungetc_len = iVar1 - 1U;
      *(uchar *)((long)ptr + sVar3) = f->ungetc[iVar1 - 1U];
      iVar1 = f->ungetc_len;
    }
    sVar2 = (*f->vtable->fi_fread)(f,(void *)((long)ptr + sVar3),size - sVar3);
    return sVar2 + sVar3;
  }
  sVar3 = (*f->vtable->fi_fread)(f,ptr,size);
  return sVar3;
}

Assistant:

size_t al_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   ASSERT(f);
   ASSERT(ptr || size == 0);

   if (f->ungetc_len) {
      int bytes_ungetc = 0;
      unsigned char *cptr = ptr;

      while (f->ungetc_len > 0 && size > 0) {
         *cptr++ = f->ungetc[--f->ungetc_len];
         ++bytes_ungetc;
         --size;
      }

      return bytes_ungetc + f->vtable->fi_fread(f, cptr, size);
   }
   else {
      return f->vtable->fi_fread(f, ptr, size);
   }
}